

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

SRes crnlib::LzmaEnc_Encode
               (CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  int *piVar1;
  byte bVar2;
  undefined4 uVar3;
  ushort uVar4;
  CRangeEnc *p_00;
  byte bVar5;
  SRes SVar6;
  int iVar7;
  uint uVar8;
  UInt32 UVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  undefined1 *puVar14;
  undefined4 *puVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  uint uVar21;
  UInt32 UVar22;
  CLzmaEnc *p;
  CRangeEnc *pCVar23;
  ulong uVar24;
  UInt16 *pUVar25;
  char *pcVar26;
  long lVar27;
  long lVar28;
  UInt32 m_2;
  ulong uVar29;
  char *pcVar30;
  UInt32 m_1;
  char *pcVar31;
  UInt32 *pUVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  UInt32 m;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  int iVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar54;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  ulong local_238;
  uint local_22c;
  ulong local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  UInt32 *local_208;
  CRangeEnc *local_200;
  ulong local_1f8;
  char *local_1f0;
  char *local_1e8;
  ulong local_1e0;
  long local_1d8;
  uint local_1cc;
  ulong local_1c8;
  ulong local_1c0;
  uint local_1b8 [6];
  ulong local_1a0;
  long local_198;
  ulong local_190;
  char *local_188;
  ulong local_180;
  int local_174;
  uint local_170;
  uint local_16c;
  long local_168;
  ulong local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  ulong local_140;
  long local_138;
  ulong *local_130;
  uint local_124;
  ulong *local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  ulong local_d8;
  uint local_d0;
  uint local_cc;
  uint local_c8 [4];
  long local_b8;
  ICompressProgress *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  UInt32 *local_90;
  long local_88;
  long local_80;
  long local_78;
  ulong local_70;
  CLenPriceEnc *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  CLenPriceEnc *local_40;
  ulong local_38;
  
  *(ISeqInStream **)((long)pp + 0x3d358) = inStream;
  *(ISeqOutStream **)((long)pp + 0x3d318) = outStream;
  local_b0 = progress;
  SVar6 = LzmaEnc_AllocAndInit((CLzmaEnc *)pp,0,alloc,allocBig);
  if (SVar6 == 0) {
    pCVar23 = (CRangeEnc *)((long)pp + 0x3d2e8);
    local_1d8 = (long)pp + 0x33be8;
    local_90 = (UInt32 *)((long)pp + 0x4cc);
    local_130 = (ulong *)((long)pp + 0x32f70);
    local_220 = (long)pp + 0x4d4;
    local_208 = (UInt32 *)((long)pp + 0x324d4);
    local_e0 = (long)pp + 0x33d68;
    local_198 = (long)pp + 0x33d80;
    local_168 = (long)pp + 0x33dc8;
    local_120 = (ulong *)((long)pp + 0x4f4);
    local_108 = (long)pp + 0x38e98;
    local_138 = (long)pp + 0x34650;
    local_a8 = (long)pp + 0x32f84;
    local_a0 = (long)pp + 0x33384;
    local_40 = (CLenPriceEnc *)((long)pp + 0x3424c);
    local_48 = (long)pp + 0x33f48;
    local_80 = (long)pp + 0x3422c;
    local_88 = (long)pp + 0x34148;
    local_58 = (long)pp + 0x33d98;
    local_78 = (long)pp + 0x33db0;
    local_68 = (CLenPriceEnc *)((long)pp + 0x38a94);
    local_98 = (long)pp + 0x326c8;
    local_b8 = (long)pp + 0x38e90;
    local_150 = (long)pp + 0x594;
    local_200 = pCVar23;
    do {
      if (*(long *)((long)pp + 0x3d358) != 0) {
        *(long *)((long)pp + 0x80) = *(long *)((long)pp + 0x3d358);
        (**pp)(*(undefined8 *)((long)pp + 0x30));
        *(undefined8 *)((long)pp + 0x3d358) = 0;
      }
      iVar7 = *(int *)((long)pp + 0x3d34c);
      if (*(int *)((long)pp + 0x3d344) != 0 || iVar7 != 0) goto LAB_001a99de;
      if (*(int *)((long)pp + 0x3d328) != 0) {
        *(undefined4 *)((long)pp + 0x3d34c) = 9;
        if (*(int *)((long)pp + 0xb8) == 0) {
          SVar6 = 9;
          goto LAB_001a9aed;
        }
LAB_001a9add:
        *(undefined4 *)((long)pp + 0x3d34c) = 8;
        SVar6 = 8;
LAB_001a9aed:
        *(undefined4 *)((long)pp + 0x3d344) = 1;
        return SVar6;
      }
      if (*(int *)((long)pp + 0xb8) != 0) goto LAB_001a9add;
      local_e8 = *(ulong *)((long)pp + 0x3d338);
      uVar29 = local_e8 & 0xffffffff;
      if (local_e8 == 0) {
        iVar7 = (**(code **)((long)pp + 0x10))(*(undefined8 *)((long)pp + 0x30));
        if (iVar7 != 0) {
          ReadMatchDistances((CLzmaEnc *)pp,local_1b8);
          RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                     ((ulong)*(uint *)((long)pp + 0x32f80) * 0x20 + local_1d8),0);
          *(undefined4 *)((long)pp + 0x32f80) =
               *(undefined4 *)(kLiteralNextStates + (ulong)*(uint *)((long)pp + 0x32f80) * 4);
          bVar5 = (**(code **)((long)pp + 8))
                            (*(undefined8 *)((long)pp + 0x30),-*(int *)((long)pp + 0x32f6c));
          lVar12 = *(long *)((long)pp + 0x33be0);
          uVar10 = bVar5 | 0x100;
          do {
            RangeEnc_EncodeBit(pCVar23,(UInt16 *)((ulong)(uVar10 >> 7 & 0x1fffffe) + lVar12),
                               uVar10 >> 7 & 1);
            bVar39 = uVar10 < 0x8000;
            uVar10 = uVar10 * 2;
          } while (bVar39);
          *(int *)((long)pp + 0x32f6c) = *(int *)((long)pp + 0x32f6c) + -1;
          uVar29 = 1;
          goto LAB_001a71df;
        }
        UVar9 = (UInt32)local_e8;
LAB_001a99d6:
        iVar7 = Flush((CLzmaEnc *)pp,UVar9);
      }
      else {
LAB_001a71df:
        iVar7 = (**(code **)((long)pp + 0x10))(*(undefined8 *)((long)pp + 0x30));
        if (iVar7 == 0) {
LAB_001a99ba:
          UVar9 = (UInt32)uVar29;
          *(long *)((long)pp + 0x3d338) =
               *(long *)((long)pp + 0x3d338) + (ulong)(UVar9 - (int)local_e8);
          goto LAB_001a99d6;
        }
        do {
          do {
            local_228 = uVar29;
            if (*(int *)((long)pp + 0x3d2e0) == 0) {
              uVar10 = *(uint *)((long)pp + 0x4c4);
              if (*(uint *)((long)pp + 0x4c0) == uVar10) {
                *(undefined8 *)((long)pp + 0x4c0) = 0;
                if (*(int *)((long)pp + 0x32f6c) == 0) {
                  uVar34 = ReadMatchDistances((CLzmaEnc *)pp,&local_16c);
                }
                else {
                  uVar34 = *(uint *)((long)pp + 0x4c8);
                  local_16c = *(uint *)((long)pp + 0x4cc);
                }
                uVar10 = *(uint *)((long)pp + 0x4d0);
                if (uVar10 < 2) {
                  uVar38 = 0xffffffff;
                  uVar10 = 1;
                }
                else {
                  uVar33 = 0x111;
                  if (uVar10 < 0x111) {
                    uVar33 = uVar10;
                  }
                  pcVar11 = (char *)(**(code **)((long)pp + 0x18))(*(undefined8 *)((long)pp + 0x30))
                  ;
                  bVar5 = pcVar11[-1];
                  if (uVar33 < 4) {
                    uVar33 = 3;
                  }
                  uVar29 = *local_130;
                  local_1b8[0] = (uint)uVar29;
                  local_1b8[1] = (uint)(uVar29 >> 0x20);
                  local_1b8[2] = (uint)local_130[1];
                  local_1b8[3] = (uint)(local_130[1] >> 0x20);
                  uVar19 = 0;
                  uVar38 = 0;
                  do {
                    uVar18 = (ulong)(*(uint *)((long)local_130 + uVar19 * 4) + 1);
                    if ((bVar5 == pcVar11[~uVar18]) &&
                       (lVar12 = -uVar18, *pcVar11 == pcVar11[lVar12])) {
                      uVar18 = 2;
                      if (uVar10 != 2) {
                        uVar24 = 2;
                        do {
                          uVar18 = uVar24;
                          if (pcVar11[uVar24 - 1] != pcVar11[uVar24 + lVar12 + -1]) break;
                          uVar24 = uVar24 + 1;
                          uVar18 = (ulong)uVar33;
                        } while (uVar33 != uVar24);
                      }
                      local_c8[uVar19] = (uint)uVar18;
                      if (local_c8[uVar38] < (uint)uVar18) {
                        uVar38 = uVar19 & 0xffffffff;
                      }
                    }
                    else {
                      local_c8[uVar19] = 0;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != 4);
                  uVar10 = local_c8[uVar38];
                  if (uVar10 < *(uint *)((long)pp + 0x32f68)) {
                    if (uVar34 < *(uint *)((long)pp + 0x32f68)) {
                      local_100 = uVar29 & 0xffffffff;
                      bVar2 = pcVar11[~(ulong)(local_1b8[0] + 1)];
                      if (((uVar10 < 2) && (uVar34 < 2)) && (bVar5 != bVar2)) goto LAB_001a7714;
                      local_180 = (ulong)*(uint *)((long)pp + 0x32f80);
                      *(uint *)((long)pp + 0x4d8) = *(uint *)((long)pp + 0x32f80);
                      pUVar25 = (UInt16 *)
                                ((ulong)(((uint)((byte)pcVar11[-2] >>
                                                (8 - *(byte *)((long)pp + 0x33bcc) & 0x1f)) +
                                         ((*(uint *)((long)pp + 0x33bd8) & (uint)local_228) <<
                                         (*(byte *)((long)pp + 0x33bcc) & 0x1f))) * 0x300) * 2 +
                                *(long *)((long)pp + 0x33be0));
                      local_1c0 = (ulong)(*(uint *)((long)pp + 0x33bdc) & (uint)local_228);
                      lVar12 = local_180 * 0x20;
                      uVar33 = (uint)(*(ushort *)(local_1d8 + lVar12 + local_1c0 * 2) >> 4);
                      iVar7 = *(int *)((long)pp + (ulong)uVar33 * 4 + 0x324d4);
                      local_210 = CONCAT71(local_210._1_7_,bVar2);
                      if (local_180 < 7) {
                        UVar9 = 0;
                        uVar37 = bVar5 + 0x100;
                        do {
                          UVar9 = UVar9 + local_208[((uint)(int)(char)uVar37 >> 7 & 0x7f0 ^
                                                    (uint)pUVar25[uVar37 >> 8]) >> 4];
                          bVar39 = uVar37 < 0x8000;
                          uVar37 = uVar37 * 2;
                        } while (bVar39);
                      }
                      else {
                        UVar9 = LitEnc_GetPriceMatched(pUVar25,(uint)bVar5,(uint)bVar2,local_208);
                      }
                      uVar29 = local_1c0;
                      auVar59 = _DAT_001ae0a0;
                      auVar58 = _DAT_001ae090;
                      auVar57 = _DAT_001ae080;
                      uVar37 = UVar9 + iVar7;
                      *(uint *)((long)pp + 0x504) = uVar37;
                      *(undefined4 *)((long)pp + 0x520) = 0xffffffff;
                      *(undefined4 *)((long)pp + 0x50c) = 0;
                      iVar7 = *(int *)((long)pp + (ulong)(uVar33 ^ 0x7f) * 4 + 0x324d4);
                      local_218 = CONCAT44(local_218._4_4_,iVar7);
                      iVar7 = *(int *)((long)pp +
                                      (ulong)(*(ushort *)((long)pp + local_180 * 2 + 0x33d68) >> 2 &
                                              0xfffffffc ^ 0x1fc) + 0x324d4) + iVar7;
                      uVar38 = 0xffffffff;
                      if ((bVar5 == (byte)local_210) &&
                         (uVar33 = local_208[*(ushort *)(local_198 + local_180 * 2) >> 4] + iVar7 +
                                   local_208[*(ushort *)(lVar12 + local_168 + local_1c0 * 2) >> 4],
                         uVar33 < uVar37)) {
                        *(uint *)((long)pp + 0x504) = uVar33;
                        *(undefined4 *)((long)pp + 0x520) = 0;
                        uVar38 = 0;
                      }
                      if (uVar10 < uVar34) {
                        uVar10 = uVar34;
                      }
                      local_238 = (ulong)uVar10;
                      if (uVar10 < 2) {
                        local_22c = (uint)uVar38;
                        uVar29 = local_228;
                        pCVar23 = local_200;
                        uVar10 = 1;
                      }
                      else {
                        *(undefined4 *)((long)pp + 0x51c) = 0;
                        uVar38 = local_130[1];
                        *local_120 = *local_130;
                        local_120[1] = uVar38;
                        lVar12 = (ulong)(uVar10 - 1) - 1;
                        auVar55._8_4_ = (int)lVar12;
                        auVar55._0_8_ = lVar12;
                        auVar55._12_4_ = (int)((ulong)lVar12 >> 0x20);
                        puVar15 = (undefined4 *)(local_238 * 0x30 + local_220);
                        uVar38 = 0;
                        do {
                          auVar45._8_4_ = (int)uVar38;
                          auVar45._0_8_ = uVar38;
                          auVar45._12_4_ = (int)(uVar38 >> 0x20);
                          auVar53 = (auVar45 | auVar58) ^ auVar59;
                          iVar35 = SUB164(auVar55 ^ auVar59,0);
                          bVar39 = iVar35 < auVar53._0_4_;
                          iVar44 = SUB164(auVar55 ^ auVar59,4);
                          iVar51 = auVar53._4_4_;
                          if ((bool)(~(iVar44 < iVar51 || iVar51 == iVar44 && bVar39) & 1)) {
                            *puVar15 = 0x40000000;
                          }
                          if (iVar44 >= iVar51 && (iVar51 != iVar44 || !bVar39)) {
                            puVar15[-0xc] = 0x40000000;
                          }
                          auVar45 = (auVar45 | auVar57) ^ auVar59;
                          iVar51 = auVar45._4_4_;
                          if (iVar51 <= iVar44 && (iVar51 != iVar44 || auVar45._0_4_ <= iVar35)) {
                            puVar15[-0x18] = 0x40000000;
                            puVar15[-0x24] = 0x40000000;
                          }
                          uVar38 = uVar38 + 4;
                          puVar15 = puVar15 + -0x30;
                        } while (((ulong)(uVar10 - 1) + 3 & 0xfffffffffffffffc) != uVar38);
                        local_210 = local_1c0 * 0x440;
                        lVar12 = local_b8 + local_210;
                        lVar28 = 0;
                        lVar27 = local_220;
                        do {
                          uVar38 = (ulong)local_c8[lVar28];
                          if (1 < uVar38) {
                            UVar9 = GetPureRepPrice((CLzmaEnc *)pp,(UInt32)lVar28,
                                                    *(UInt32 *)((long)pp + 0x32f80),(UInt32)uVar29);
                            puVar16 = (uint *)(uVar38 * 0x30 + local_220);
                            do {
                              uVar38 = uVar38 - 1;
                              uVar10 = *(int *)(lVar12 + 4 + uVar38 * 4) + UVar9 + iVar7;
                              if (uVar10 < *puVar16) {
                                *puVar16 = uVar10;
                                puVar16[6] = 0;
                                puVar16[7] = (UInt32)lVar28;
                                puVar16[2] = 0;
                              }
                              puVar16 = puVar16 + -0xc;
                              lVar27 = local_220;
                            } while ((uVar38 & 0xfffffffe) != 0);
                          }
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 4);
                        uVar29 = (ulong)(local_c8[0] + 1);
                        if (local_c8[0] < 2) {
                          uVar29 = 2;
                        }
                        if ((uint)uVar29 <= uVar34) {
                          iVar7 = *(int *)((long)pp +
                                          (ulong)(*(ushort *)
                                                   ((long)pp +
                                                   (ulong)*(uint *)((long)pp + 0x32f80) * 2 +
                                                   0x33d68) >> 4) * 4 + 0x324d4);
                          uVar38 = 0xfffffffe;
                          do {
                            uVar38 = (ulong)((int)uVar38 + 2);
                          } while (*(uint *)((long)pp + uVar38 * 4 + 0x326d4) < (uint)uVar29);
                          while( true ) {
                            uVar10 = *(uint *)((long)pp + (ulong)((int)uVar38 + 1) * 4 + 0x326d4);
                            uVar34 = (uint)uVar29;
                            uVar33 = 3;
                            if (uVar34 < 5) {
                              uVar33 = uVar34 - 2;
                            }
                            if ((ulong)uVar10 < 0x80) {
                              iVar35 = *(int *)((ulong)uVar33 * 0x200 + local_a0 + (ulong)uVar10 * 4
                                               );
                            }
                            else {
                              iVar35 = 6;
                              if (-1 < (int)(uVar10 - 0x80000)) {
                                iVar35 = 0x12;
                              }
                              iVar35 = *(int *)((ulong)uVar33 * 0x100 + local_a8 +
                                               (ulong)((uint)*(byte *)((long)pp +
                                                                      (ulong)(uVar10 >>
                                                                             (sbyte)iVar35) +
                                                                      0x304d4) + iVar35 * 2) * 4) +
                                       *(int *)((long)pp + (ulong)(uVar10 & 0xf) * 4 + 0x33b84);
                              lVar27 = local_220;
                            }
                            uVar33 = *(int *)(local_138 + local_210 + (ulong)(uVar34 - 2) * 4) +
                                     (int)local_218 + iVar7 + iVar35;
                            if (uVar33 < *(uint *)(lVar27 + uVar29 * 0x30)) {
                              puVar16 = (uint *)(uVar29 * 0x30 + lVar27);
                              *puVar16 = uVar33;
                              puVar16[6] = 0;
                              puVar16[7] = uVar10 + 4;
                              puVar16[2] = 0;
                            }
                            uVar10 = *(uint *)((long)pp + uVar38 * 4 + 0x326d4);
                            uVar33 = (int)uVar38 + 2;
                            if ((uVar34 == uVar10) && (uVar33 == local_16c)) break;
                            if (uVar34 == uVar10) {
                              uVar38 = (ulong)uVar33;
                            }
                            uVar29 = (ulong)(uVar34 + 1);
                          }
                        }
                        local_f0 = (ulong)((int)local_228 + 1);
                        iVar7 = 0xffe;
                        local_f8 = 1;
                        local_110 = local_228 & 0xffffffff;
                        uVar38 = 0;
                        do {
                          uVar19 = local_110;
                          pCVar23 = local_200;
                          uVar29 = local_228;
                          uVar24 = local_110 & 0xffffffff;
                          UVar22 = (int)uVar38 + 1;
                          uVar18 = (ulong)UVar22;
                          local_1c8 = uVar38;
                          UVar9 = ReadMatchDistances((CLzmaEnc *)pp,&local_170);
                          uVar38 = (ulong)UVar9;
                          if (*(uint *)((long)pp + 0x32f68) <= UVar9) {
                            *(uint *)((long)pp + 0x4cc) = local_170;
                            *(UInt32 *)((long)pp + 0x4c8) = UVar9;
                            break;
                          }
                          lVar12 = uVar18 * 0x30;
                          piVar1 = (int *)(local_220 + lVar12);
                          uVar10 = *(uint *)(local_220 + 0x18 + lVar12);
                          uVar29 = (ulong)uVar10;
                          local_160 = CONCAT44(local_160._4_4_,iVar7);
                          local_218 = uVar18;
                          local_60 = uVar38;
                          if (*(int *)(local_220 + 8 + lVar12) == 0) {
                            uVar34 = *(uint *)(local_220 + 4 + uVar29 * 0x30);
                            uVar38 = (ulong)uVar34;
                            if (uVar10 == (uint)local_1c8) goto LAB_001a82b1;
LAB_001a82eb:
                            uVar33 = piVar1[7];
                            if (3 < uVar33) {
                              uVar10 = *(uint *)(kMatchNextStates + (ulong)uVar34 * 4);
                              goto LAB_001a836a;
                            }
                            uVar10 = *(uint *)(kRepNextStates + (ulong)uVar34 * 4);
LAB_001a82f9:
                            uVar34 = *(uint *)(local_220 + uVar29 * 0x30 + 0x20 + (ulong)uVar33 * 4)
                            ;
                            local_1b8[0] = uVar34;
                            if (uVar33 == 0) {
                              iVar7 = 1;
LAB_001a83a5:
                              memcpy((void *)((long)local_1b8 + (ulong)(uint)(iVar7 << 2)),
                                     (void *)((long)local_120 +
                                             (ulong)(uint)(iVar7 << 2) + uVar29 * 0x30),
                                     (ulong)(uVar33 * -4 + 0xc));
                              uVar34 = local_1b8[0];
                            }
                            else {
                              memcpy(local_1b8 + 1,local_120 + uVar29 * 6,(ulong)uVar33 * 4);
                              if (uVar33 < 3) {
                                iVar7 = uVar33 + 1;
                                goto LAB_001a83a5;
                              }
                            }
                            uVar29 = (ulong)uVar34;
                          }
                          else {
                            uVar10 = uVar10 - 1;
                            if (piVar1[3] == 0) {
                              uVar29 = (ulong)uVar10;
                              uVar34 = *(uint *)(kLiteralNextStates +
                                                (ulong)*(uint *)(local_220 + 4 + uVar29 * 0x30) * 4)
                              ;
                              uVar38 = (ulong)uVar34;
                              if (uVar10 != (uint)local_1c8) goto LAB_001a82eb;
                            }
                            else {
                              uVar29 = (ulong)(uint)piVar1[4];
                              uVar33 = piVar1[5];
                              puVar14 = kMatchNextStates;
                              if (uVar33 < 4) {
                                puVar14 = kRepNextStates;
                              }
                              uVar38 = (ulong)*(uint *)(kLiteralNextStates +
                                                       (ulong)*(uint *)(puVar14 +
                                                                       (ulong)*(uint *)(local_220 +
                                                                                        4 + uVar29 *
                                                                                            0x30) *
                                                                       4) * 4);
                              if (uVar10 != (uint)local_1c8) {
                                uVar10 = *(uint *)(kRepNextStates + uVar38 * 4);
                                if (uVar33 < 4) goto LAB_001a82f9;
LAB_001a836a:
                                local_1b8[0] = uVar33 - 4;
                                local_1b8[3] = (uint)local_120[uVar29 * 6 + 1];
                                local_1b8[1] = (uint)local_120[uVar29 * 6];
                                local_1b8[2] = (uint)(local_120[uVar29 * 6] >> 0x20);
                                uVar29 = (ulong)local_1b8[0];
                                goto LAB_001a83e2;
                              }
                            }
LAB_001a82b1:
                            if (piVar1[7] == 0) {
                              puVar14 = kShortRepNextStates;
                            }
                            else {
                              puVar14 = kLiteralNextStates;
                            }
                            uVar10 = *(uint *)(puVar14 + uVar38 * 4);
                            uVar29 = local_100;
                          }
LAB_001a83e2:
                          uVar34 = (int)uVar19 + 1;
                          piVar1[1] = uVar10;
                          piVar1[8] = (int)uVar29;
                          *(ulong *)(piVar1 + 9) = CONCAT44(local_1b8[2],local_1b8[1]);
                          piVar1[0xb] = local_1b8[3];
                          iVar7 = *piVar1;
                          local_1a0 = uVar24;
                          local_1f0 = (char *)(**(code **)((long)pp + 0x18))
                                                        (*(undefined8 *)((long)pp + 0x30));
                          local_188 = local_1f0 + -1;
                          bVar5 = local_1f0[-1];
                          local_210 = (ulong)bVar5;
                          local_1e8 = (char *)(ulong)((int)uVar29 + 1);
                          local_1e0 = (ulong)(*(uint *)((long)pp + 0x33bdc) & uVar34);
                          local_190 = (ulong)uVar10;
                          lVar27 = local_190 * 0x20;
                          lVar12 = local_1d8 + lVar27;
                          uVar4 = *(ushort *)(lVar12 + local_1e0 * 2) >> 4;
                          iVar35 = *(int *)((long)pp + (ulong)uVar4 * 4 + 0x324d4);
                          pUVar25 = (UInt16 *)
                                    ((ulong)(((uint)((byte)local_1f0[-2] >>
                                                    (8 - *(byte *)((long)pp + 0x33bcc) & 0x1f)) +
                                             ((*(uint *)((long)pp + 0x33bd8) & uVar34) <<
                                             (*(byte *)((long)pp + 0x33bcc) & 0x1f))) * 0x300) * 2 +
                                    *(long *)((long)pp + 0x33be0));
                          local_1c0 = CONCAT44(local_1c0._4_4_,
                                               (uint)(byte)local_188[-(long)local_1e8]);
                          local_110 = (ulong)uVar34;
                          local_100 = uVar29;
                          local_180._0_4_ = iVar7;
                          if (uVar10 < 7) {
                            UVar9 = 0;
                            uVar10 = bVar5 + 0x100;
                            do {
                              UVar9 = UVar9 + local_208[((uint)(int)(char)uVar10 >> 7 & 0x7f0 ^
                                                        (uint)pUVar25[uVar10 >> 8]) >> 4];
                              bVar39 = uVar10 < 0x8000;
                              uVar10 = uVar10 * 2;
                            } while (bVar39);
                          }
                          else {
                            UVar9 = LitEnc_GetPriceMatched
                                              (pUVar25,(uint)bVar5,
                                               (uint)(byte)local_188[-(long)local_1e8],local_208);
                          }
                          auVar59 = _DAT_001ae0a0;
                          auVar58 = _DAT_001ae090;
                          auVar57 = _DAT_001ae080;
                          uVar37 = iVar35 + iVar7 + UVar9;
                          uVar34 = (int)local_1c8 + 2;
                          puVar16 = (uint *)(local_220 + (ulong)uVar34 * 0x30);
                          uVar10 = *(uint *)(local_220 + (ulong)uVar34 * 0x30);
                          bVar39 = uVar37 < uVar10;
                          uVar33 = (uint)local_218;
                          if (bVar39) {
                            *puVar16 = uVar37;
                            puVar16[6] = uVar33;
                            puVar16[7] = 0xffffffff;
                            puVar16[2] = 0;
                            uVar4 = *(ushort *)(lVar12 + local_1e0 * 2) >> 4;
                            uVar10 = uVar37;
                          }
                          local_180._0_4_ = (int)local_180 + local_208[uVar4 ^ 0x7f];
                          local_1cc = *(int *)((long)local_208 +
                                              (ulong)(*(ushort *)(local_e0 + local_190 * 2) >> 2 &
                                                      0xfffffffc ^ 0x1fc)) + (int)local_180;
                          if (((char)local_1c0 == (byte)local_210) &&
                             (((uVar33 <= puVar16[6] || (puVar16[7] != 0)) &&
                              (uVar36 = local_208[*(ushort *)(local_198 + local_190 * 2) >> 4] +
                                        local_1cc +
                                        local_208[*(ushort *)(lVar27 + local_168 + local_1e0 * 2) >>
                                                  4], uVar36 <= uVar10)))) {
                            *puVar16 = uVar36;
                            puVar16[6] = uVar33;
                            puVar16[7] = 0;
                            puVar16[2] = 0;
                            bVar39 = true;
                          }
                          local_158 = local_160 & 0xffffffff;
                          uVar10 = *(uint *)((long)pp + 0x4d0);
                          local_118 = (ulong)uVar10;
                          uVar36 = 0xffe - (int)local_1c8;
                          if (uVar10 <= uVar36) {
                            uVar36 = uVar10;
                          }
                          if (1 < uVar36) {
                            uVar21 = *(uint *)((long)pp + 0x32f68);
                            uVar29 = (ulong)uVar21;
                            uVar8 = uVar21;
                            if (uVar36 < uVar21) {
                              uVar8 = uVar36;
                            }
                            local_1f8 = CONCAT44(local_1f8._4_4_,uVar8);
                            local_d0 = (uint)local_160;
                            if (!bVar39 && (char)local_1c0 != (byte)local_210) {
                              uVar17 = uVar21 + 1;
                              uVar13 = uVar36;
                              if (uVar17 < uVar36) {
                                uVar13 = uVar17;
                              }
                              if (1 < uVar13) {
                                uVar13 = local_d0;
                                if (uVar10 < local_d0) {
                                  uVar13 = uVar10;
                                }
                                if (uVar17 <= uVar13) {
                                  uVar13 = uVar17;
                                }
                                uVar38 = local_158;
                                if (local_118 < local_158) {
                                  uVar38 = local_118;
                                }
                                if (uVar17 <= uVar38) {
                                  uVar38 = (ulong)uVar17;
                                }
                                uVar19 = 1;
                                do {
                                  uVar18 = uVar19;
                                  if (local_1f0[uVar19 - 1] !=
                                      local_1f0[uVar19 + (-1 - (long)local_1e8)]) break;
                                  uVar19 = uVar19 + 1;
                                  uVar18 = (ulong)uVar13;
                                } while (uVar38 != uVar19);
                                iVar7 = (int)uVar18;
                                if (1 < iVar7 - 1U) {
                                  uVar19 = (ulong)((int)local_1a0 + 2U &
                                                  *(uint *)((long)pp + 0x33bdc));
                                  uVar38 = (ulong)*(uint *)(kLiteralNextStates + local_190 * 4);
                                  iVar35 = *(int *)((long)pp +
                                                   (ulong)(*(ushort *)
                                                            (local_1d8 + uVar38 * 0x20 + uVar19 * 2)
                                                           >> 2 & 0xfffffffc ^ 0x1fc) + 0x324d4);
                                  iVar44 = *(int *)((long)pp +
                                                   (ulong)(*(ushort *)
                                                            ((long)pp + uVar38 * 2 + 0x33d68) >> 2 &
                                                           0xfffffffc ^ 0x1fc) + 0x324d4);
                                  uVar13 = (iVar7 - 1U) + uVar34;
                                  if ((uint)local_238 < uVar13) {
                                    lVar27 = (uVar33 + iVar7) - local_238;
                                    lVar12 = lVar27 + -1;
                                    auVar53._8_4_ = (int)lVar12;
                                    auVar53._0_8_ = lVar12;
                                    auVar53._12_4_ = (int)((ulong)lVar12 >> 0x20);
                                    puVar15 = (undefined4 *)(local_238 * 0x30 + local_150);
                                    uVar18 = 0;
                                    do {
                                      auVar46._8_4_ = (int)uVar18;
                                      auVar46._0_8_ = uVar18;
                                      auVar46._12_4_ = (int)(uVar18 >> 0x20);
                                      auVar55 = (auVar46 | auVar58) ^ auVar59;
                                      iVar51 = SUB164(auVar53 ^ auVar59,0);
                                      bVar39 = iVar51 < auVar55._0_4_;
                                      iVar52 = SUB164(auVar53 ^ auVar59,4);
                                      iVar54 = auVar55._4_4_;
                                      if ((bool)(~(iVar52 < iVar54 || iVar54 == iVar52 && bVar39) &
                                                1)) {
                                        puVar15[-0x24] = 0x40000000;
                                      }
                                      if (iVar52 >= iVar54 && (iVar54 != iVar52 || !bVar39)) {
                                        puVar15[-0x18] = 0x40000000;
                                      }
                                      auVar55 = (auVar46 | auVar57) ^ auVar59;
                                      iVar54 = auVar55._4_4_;
                                      if (iVar54 <= iVar52 &&
                                          (iVar54 != iVar52 || auVar55._0_4_ <= iVar51)) {
                                        puVar15[-0xc] = 0x40000000;
                                        *puVar15 = 0x40000000;
                                      }
                                      uVar18 = uVar18 + 4;
                                      puVar15 = puVar15 + 0x30;
                                      local_238 = (ulong)(uVar33 + iVar7);
                                    } while ((lVar27 + 3U & 0xfffffffffffffffc) != uVar18);
                                  }
                                  uVar33 = iVar35 + uVar37 + iVar44 +
                                           *(int *)(uVar19 * 0x440 + local_108 +
                                                   (ulong)(iVar7 - 3) * 4) +
                                           local_208[*(ushort *)(local_198 + uVar38 * 2) >> 4] +
                                           *(int *)((long)local_208 +
                                                   (ulong)(*(ushort *)
                                                            (uVar38 * 0x20 + local_168 + uVar19 * 2)
                                                           >> 2 & 0xfffffffc ^ 0x1fc));
                                  lVar12 = (ulong)uVar13 * 0x30;
                                  if (uVar33 < *(uint *)(local_220 + lVar12)) {
                                    puVar16 = (uint *)(lVar12 + local_220);
                                    *puVar16 = uVar33;
                                    puVar16[6] = uVar34;
                                    puVar16[7] = 0;
                                    puVar16[2] = 1;
                                    puVar16[3] = 0;
                                  }
                                }
                              }
                            }
                            if (uVar10 < uVar21) {
                              uVar21 = uVar10;
                            }
                            local_70 = (ulong)uVar21;
                            if (local_d0 <= uVar21) {
                              local_70 = local_158;
                            }
                            if (uVar10 < local_d0) {
                              local_d0 = uVar10;
                            }
                            local_50 = local_118;
                            if (uVar29 < local_118) {
                              local_50 = uVar29;
                            }
                            if (local_158 <= local_50) {
                              local_50 = local_158;
                            }
                            local_1c0 = local_1e0 * 0x440;
                            lVar12 = local_b8 + local_1c0;
                            pcVar11 = (char *)0x2;
                            lVar28 = 0;
                            pcVar26 = local_188;
                            lVar27 = local_220;
                            uVar38 = local_218;
                            pcVar30 = local_1f0;
                            local_1a0 = uVar29;
                            local_124 = uVar36;
                            do {
                              pcVar31 = pcVar26 + -(ulong)(local_1b8[lVar28] + 1);
                              if ((*pcVar26 == *pcVar31) && (*pcVar30 == pcVar31[1])) {
                                uVar29 = 2;
                                if (2 < uVar8) {
                                  uVar19 = 2;
                                  do {
                                    uVar29 = uVar19;
                                    if (pcVar30[uVar19 - 1] !=
                                        pcVar30[uVar19 + (-1 - (ulong)(local_1b8[lVar28] + 1))])
                                    break;
                                    uVar19 = uVar19 + 1;
                                    uVar29 = local_70;
                                  } while (local_50 != uVar19);
                                }
                                iVar7 = (int)uVar29;
                                uVar34 = iVar7 + (int)uVar38;
                                local_160 = (ulong)uVar34;
                                uVar10 = (uint)local_238;
                                if ((uint)local_238 < uVar34) {
                                  lVar27 = ~local_238 + (ulong)uVar34;
                                  auVar40._8_4_ = (int)lVar27;
                                  auVar40._0_8_ = lVar27;
                                  auVar40._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                  puVar15 = (undefined4 *)(local_238 * 0x30 + local_150);
                                  uVar38 = 0;
                                  do {
                                    auVar47._8_4_ = (int)uVar38;
                                    auVar47._0_8_ = uVar38;
                                    auVar47._12_4_ = (int)(uVar38 >> 0x20);
                                    auVar55 = (auVar47 | auVar58) ^ auVar59;
                                    iVar35 = SUB164(auVar40 ^ auVar59,0);
                                    bVar39 = iVar35 < auVar55._0_4_;
                                    iVar44 = SUB164(auVar40 ^ auVar59,4);
                                    iVar51 = auVar55._4_4_;
                                    if ((bool)(~(iVar44 < iVar51 || iVar51 == iVar44 && bVar39) & 1)
                                       ) {
                                      puVar15[-0x24] = 0x40000000;
                                    }
                                    if (iVar44 >= iVar51 && (iVar51 != iVar44 || !bVar39)) {
                                      puVar15[-0x18] = 0x40000000;
                                    }
                                    auVar55 = (auVar47 | auVar57) ^ auVar59;
                                    iVar51 = auVar55._4_4_;
                                    if (iVar51 <= iVar44 &&
                                        (iVar51 != iVar44 || auVar55._0_4_ <= iVar35)) {
                                      puVar15[-0xc] = 0x40000000;
                                      *puVar15 = 0x40000000;
                                    }
                                    uVar38 = uVar38 + 4;
                                    puVar15 = puVar15 + 0x30;
                                    uVar10 = uVar34;
                                  } while (((local_160 - local_238) + 3 & 0xfffffffffffffffc) !=
                                           uVar38);
                                }
                                local_210 = CONCAT44(local_210._4_4_,uVar10);
                                UVar22 = (UInt32)lVar28;
                                local_1e8 = pcVar11;
                                UVar9 = GetPureRepPrice((CLzmaEnc *)pp,UVar22,(UInt32)local_190,
                                                        (UInt32)local_1e0);
                                pUVar32 = local_208;
                                iVar35 = UVar9 + local_1cc;
                                uVar29 = uVar29 & 0xffffffff;
                                uVar38 = uVar29;
                                do {
                                  uVar10 = *(int *)(lVar12 + uVar38 * 4) + iVar35;
                                  lVar27 = (ulong)(uint)((int)local_f8 + (int)uVar38) * 0x30;
                                  if (uVar10 < *(uint *)(local_220 + lVar27)) {
                                    puVar16 = (uint *)(lVar27 + local_220);
                                    *puVar16 = uVar10;
                                    puVar16[6] = (uint)local_218;
                                    puVar16[7] = UVar22;
                                    puVar16[2] = 0;
                                  }
                                  uVar38 = uVar38 - 1;
                                } while ((uVar38 & 0xfffffffe) != 0);
                                uVar10 = iVar7 + 1;
                                local_1e8 = (char *)((ulong)local_1e8 & 0xffffffff);
                                if (lVar28 == 0) {
                                  local_1e8 = (char *)(ulong)uVar10;
                                }
                                uVar33 = (int)local_1a0 + iVar7 + 1;
                                uVar34 = local_124;
                                if (uVar33 < local_124) {
                                  uVar34 = uVar33;
                                }
                                uVar37 = uVar10;
                                if (uVar10 < uVar34) {
                                  uVar34 = uVar33;
                                  if (local_d0 < uVar33) {
                                    uVar34 = local_d0;
                                  }
                                  uVar38 = local_158;
                                  if (local_118 < local_158) {
                                    uVar38 = local_118;
                                  }
                                  uVar19 = (ulong)uVar10;
                                  if (uVar33 <= uVar38) {
                                    uVar38 = (ulong)uVar33;
                                  }
                                  do {
                                    uVar18 = uVar19;
                                    if (local_188[uVar19] != pcVar31[uVar19]) break;
                                    uVar19 = uVar19 + 1;
                                    uVar18 = (ulong)uVar34;
                                  } while (uVar38 != uVar19);
                                  uVar37 = (uint)uVar18;
                                }
                                if (uVar37 - uVar10 < 2) {
                                  uVar29 = local_210 & 0xffffffff;
                                  auVar57 = _DAT_001ae080;
                                  auVar58 = _DAT_001ae090;
                                  auVar59 = _DAT_001ae0a0;
                                }
                                else {
                                  local_38 = (ulong)*(uint *)(kRepNextStates + local_190 * 4);
                                  uVar34 = iVar7 + (int)local_110;
                                  local_cc = *(uint *)((long)pp + 0x33bdc);
                                  local_174 = *(int *)(local_108 + local_1c0 +
                                                      (ulong)(iVar7 - 2) * 4);
                                  local_140 = CONCAT44(local_140._4_4_,
                                                       *(undefined4 *)
                                                        ((long)pp +
                                                        (ulong)(*(ushort *)
                                                                 (local_38 * 0x20 + local_1d8 +
                                                                 (ulong)(local_cc & uVar34) * 2) >>
                                                               4) * 4 + 0x324d4));
                                  local_148 = uVar29;
                                  local_d8 = (ulong)(uVar37 - uVar10);
                                  UVar9 = LitEnc_GetPriceMatched
                                                    ((UInt16 *)
                                                     ((ulong)(((uint)((byte)local_188[iVar7 - 1] >>
                                                                     (8 - *(byte *)((long)pp +
                                                                                   0x33bcc) & 0x1f))
                                                              + ((uVar34 & *(uint *)((long)pp +
                                                                                    0x33bd8)) <<
                                                                (*(byte *)((long)pp + 0x33bcc) &
                                                                0x1f))) * 0x300) * 2 +
                                                     *(long *)((long)pp + 0x33be0)),
                                                     (uint)(byte)local_188[uVar29],
                                                     (uint)(byte)pcVar31[uVar29],local_208);
                                  auVar59 = _DAT_001ae0a0;
                                  auVar58 = _DAT_001ae090;
                                  auVar57 = _DAT_001ae080;
                                  local_148 = CONCAT44(local_148._4_4_,UVar9);
                                  uVar38 = (ulong)*(uint *)(kLiteralNextStates + local_38 * 4);
                                  uVar19 = (ulong)(iVar7 + (int)local_110 + 1U & local_cc);
                                  iVar44 = *(int *)((long)pp +
                                                   (ulong)(*(ushort *)
                                                            (local_1d8 + uVar38 * 0x20 + uVar19 * 2)
                                                           >> 2 & 0xfffffffc ^ 0x1fc) + 0x324d4);
                                  iVar51 = *(int *)((long)pp +
                                                   (ulong)(*(ushort *)
                                                            ((long)pp + uVar38 * 2 + 0x33d68) >> 2 &
                                                           0xfffffffc ^ 0x1fc) + 0x324d4);
                                  uVar10 = (int)local_160 + (int)local_d8 + 1;
                                  uVar34 = (uint)local_218;
                                  if ((uint)local_210 < uVar10) {
                                    uVar29 = (ulong)(uVar37 + uVar34);
                                    lVar27 = ~(local_210 & 0xffffffff) + uVar29;
                                    auVar41._8_4_ = (int)lVar27;
                                    auVar41._0_8_ = lVar27;
                                    auVar41._12_4_ = (int)((ulong)lVar27 >> 0x20);
                                    uVar18 = (ulong)(iVar7 + uVar34);
                                    if (iVar7 + uVar34 < local_238) {
                                      uVar18 = local_238;
                                    }
                                    puVar15 = (undefined4 *)(uVar18 * 0x30 + local_150);
                                    uVar24 = 0;
                                    do {
                                      auVar48._8_4_ = (int)uVar24;
                                      auVar48._0_8_ = uVar24;
                                      auVar48._12_4_ = (int)(uVar24 >> 0x20);
                                      auVar55 = (auVar48 | auVar58) ^ auVar59;
                                      iVar7 = SUB164(auVar41 ^ auVar59,0);
                                      bVar39 = iVar7 < auVar55._0_4_;
                                      iVar52 = SUB164(auVar41 ^ auVar59,4);
                                      iVar54 = auVar55._4_4_;
                                      if ((bool)(~(iVar52 < iVar54 || iVar54 == iVar52 && bVar39) &
                                                1)) {
                                        puVar15[-0x24] = 0x40000000;
                                      }
                                      if (iVar52 >= iVar54 && (iVar54 != iVar52 || !bVar39)) {
                                        puVar15[-0x18] = 0x40000000;
                                      }
                                      auVar55 = (auVar48 | auVar57) ^ auVar59;
                                      iVar54 = auVar55._4_4_;
                                      if (iVar54 <= iVar52 &&
                                          (iVar54 != iVar52 || auVar55._0_4_ <= iVar7)) {
                                        puVar15[-0xc] = 0x40000000;
                                        *puVar15 = 0x40000000;
                                      }
                                      uVar24 = uVar24 + 4;
                                      puVar15 = puVar15 + 0x30;
                                      pUVar32 = local_208;
                                    } while (((uVar29 - uVar18) + 3 & 0xfffffffffffffffc) != uVar24)
                                    ;
                                  }
                                  else {
                                    uVar29 = local_210 & 0xffffffff;
                                  }
                                  uVar33 = local_174 + iVar35 + (int)local_140 + UVar9 + iVar51 +
                                           iVar44 + *(int *)(uVar19 * 0x440 + local_108 +
                                                            (ulong)((int)local_d8 - 2) * 4) +
                                           pUVar32[*(ushort *)(local_198 + uVar38 * 2) >> 4] +
                                           *(int *)((long)pUVar32 +
                                                   (ulong)(*(ushort *)
                                                            (uVar38 * 0x20 + local_168 + uVar19 * 2)
                                                           >> 2 & 0xfffffffc ^ 0x1fc));
                                  lVar27 = (ulong)uVar10 * 0x30;
                                  if (uVar33 < *(uint *)(local_220 + lVar27)) {
                                    puVar16 = (uint *)(lVar27 + local_220);
                                    *puVar16 = uVar33;
                                    puVar16[6] = (int)local_160 + 1;
                                    puVar16[7] = 0;
                                    puVar16[2] = 1;
                                    puVar16[3] = 1;
                                    puVar16[4] = uVar34;
                                    puVar16[5] = UVar22;
                                  }
                                }
                                local_238 = uVar29;
                                pcVar11 = local_1e8;
                                pcVar26 = local_188;
                                lVar27 = local_220;
                                uVar38 = local_218;
                                pcVar30 = local_1f0;
                                uVar8 = (uint)local_1f8;
                              }
                              lVar28 = lVar28 + 1;
                            } while (lVar28 != 4);
                            uVar10 = (uint)local_60;
                            uVar34 = uVar10;
                            if (uVar8 < uVar10) {
                              local_170 = 0;
                              do {
                                uVar29 = (ulong)local_170;
                                local_170 = local_170 + 2;
                              } while (*(uint *)((long)pp + uVar29 * 4 + 0x326d4) < uVar8);
                              *(uint *)((long)pp + uVar29 * 4 + 0x326d4) = uVar8;
                              uVar34 = uVar8;
                            }
                            if ((uint)pcVar11 <= uVar34) {
                              local_180 = CONCAT44(local_180._4_4_,
                                                   (int)local_180 +
                                                   local_208[*(ushort *)(local_e0 + local_190 * 2)
                                                             >> 4]);
                              iVar7 = (int)local_218;
                              if ((uint)local_238 < uVar34 + iVar7) {
                                if ((uint)local_118 <= uVar10) {
                                  uVar10 = (uint)local_118;
                                }
                                if ((uint)local_1a0 <= uVar10) {
                                  uVar10 = (uint)local_1a0;
                                }
                                uVar33 = (uint)local_158;
                                uVar34 = uVar33;
                                if (uVar10 < uVar33) {
                                  uVar34 = uVar10;
                                }
                                lVar12 = ~local_238 + (ulong)(uVar34 + iVar7);
                                auVar42._8_4_ = (int)lVar12;
                                auVar42._0_8_ = lVar12;
                                auVar42._12_4_ = (int)((ulong)lVar12 >> 0x20);
                                if (uVar33 <= uVar10) {
                                  uVar10 = uVar33;
                                }
                                lVar12 = (uVar10 + iVar7) - local_238;
                                puVar15 = (undefined4 *)(local_238 * 0x30 + local_150);
                                uVar29 = 0;
                                do {
                                  auVar49._8_4_ = (int)uVar29;
                                  auVar49._0_8_ = uVar29;
                                  auVar49._12_4_ = (int)(uVar29 >> 0x20);
                                  auVar55 = (auVar49 | auVar58) ^ auVar59;
                                  iVar35 = SUB164(auVar42 ^ auVar59,0);
                                  bVar39 = iVar35 < auVar55._0_4_;
                                  iVar44 = SUB164(auVar42 ^ auVar59,4);
                                  iVar51 = auVar55._4_4_;
                                  if ((bool)(~(iVar44 < iVar51 || iVar51 == iVar44 && bVar39) & 1))
                                  {
                                    puVar15[-0x24] = 0x40000000;
                                  }
                                  if (iVar44 >= iVar51 && (iVar51 != iVar44 || !bVar39)) {
                                    puVar15[-0x18] = 0x40000000;
                                  }
                                  auVar55 = (auVar49 | auVar57) ^ auVar59;
                                  iVar51 = auVar55._4_4_;
                                  if (iVar51 <= iVar44 &&
                                      (iVar51 != iVar44 || auVar55._0_4_ <= iVar35)) {
                                    puVar15[-0xc] = 0x40000000;
                                    *puVar15 = 0x40000000;
                                  }
                                  uVar29 = uVar29 + 4;
                                  puVar15 = puVar15 + 0x30;
                                  local_238 = (ulong)(uVar34 + iVar7);
                                } while ((lVar12 + 3U & 0xfffffffffffffffc) != uVar29);
                              }
                              uVar29 = 0xfffffffe;
                              do {
                                iVar7 = (int)uVar29;
                                uVar29 = (ulong)(iVar7 + 2);
                              } while (*(uint *)((long)pp + uVar29 * 4 + 0x326d4) < (uint)pcVar11);
                              uVar10 = *(uint *)((long)pp + (ulong)(iVar7 + 3) * 4 + 0x326d4);
                              uVar38 = (ulong)uVar10;
                              iVar7 = 0x12;
                              if ((int)(uVar10 - 0x80000) < 0) {
                                iVar7 = 6;
                              }
                              uVar10 = (uint)*(byte *)((long)pp +
                                                      (ulong)(uVar10 >> (sbyte)iVar7) + 0x304d4) +
                                       iVar7 * 2;
                              local_1cc = local_170;
                              local_1f8 = (ulong)(*(int *)((long)pp + 0x32f68) + 1);
                              uVar19 = (ulong)pcVar11 & 0xffffffff;
                              do {
                                local_160 = (ulong)uVar10;
                                do {
                                  uVar10 = (uint)uVar38;
                                  uVar34 = (uint)uVar19;
                                  iVar7 = 0;
                                  while( true ) {
                                    uVar33 = uVar34 + iVar7;
                                    uVar18 = (ulong)((uVar34 - 2) + iVar7);
                                    lVar12 = uVar18 * 4;
                                    if (4 < uVar33) {
                                      uVar18 = 3;
                                    }
                                    if (uVar10 < 0x80) {
                                      iVar35 = *(int *)(uVar18 * 0x200 + local_a0 + uVar38 * 4);
                                    }
                                    else {
                                      iVar35 = *(int *)((long)pp +
                                                       (ulong)(uVar10 & 0xf) * 4 + 0x33b84) +
                                               *(int *)(uVar18 * 0x100 + local_a8 + local_160 * 4);
                                    }
                                    uVar37 = *(int *)(local_1c0 + local_138 + lVar12) +
                                             (int)local_180 + iVar35;
                                    lVar12 = (ulong)((int)local_1c8 + uVar34 + iVar7 + 1) * 0x30;
                                    if (uVar37 < *(uint *)(lVar27 + lVar12)) {
                                      puVar16 = (uint *)(lVar12 + lVar27);
                                      *puVar16 = uVar37;
                                      puVar16[6] = (uint)local_218;
                                      puVar16[7] = uVar10 + 4;
                                      puVar16[2] = 0;
                                    }
                                    if (uVar33 == *(uint *)((long)pp + uVar29 * 4 + 0x326d4)) break;
                                    iVar7 = iVar7 + 1;
                                  }
                                  pcVar26 = (char *)(ulong)((int)pcVar11 + iVar7 + 1);
                                  lVar12 = (long)local_188 - (ulong)(uVar10 + 1);
                                  uVar21 = uVar34 + iVar7 + 1;
                                  uVar36 = (int)local_1f8 + uVar33;
                                  if (local_124 <= uVar36) {
                                    uVar36 = local_124;
                                  }
                                  pcVar30 = (char *)(ulong)uVar21;
                                  if (uVar21 < uVar36) {
                                    pcVar30 = pcVar26;
                                    do {
                                      if (local_188[(long)pcVar30] != pcVar30[lVar12]) break;
                                      pcVar30 = pcVar30 + 1;
                                    } while (pcVar30 < (char *)(ulong)uVar36);
                                  }
                                  iVar35 = (int)pcVar30;
                                  uVar36 = (~uVar34 + iVar35) - iVar7;
                                  local_210 = uVar19;
                                  local_1f0 = pcVar11;
                                  if (1 < uVar36) {
                                    local_1a0 = CONCAT44(local_1a0._4_4_,uVar21);
                                    local_d8 = (ulong)*(uint *)(kMatchNextStates + local_190 * 4);
                                    uVar21 = uVar33 + (int)local_f0;
                                    local_148 = CONCAT44(local_148._4_4_,
                                                         *(uint *)((long)pp + 0x33bdc));
                                    local_1e0 = (ulong)(*(uint *)((long)pp + 0x33bdc) & uVar21);
                                    local_174 = *(int *)((long)pp +
                                                        (ulong)(*(ushort *)
                                                                 (local_d8 * 0x20 + local_1d8 +
                                                                 local_1e0 * 2) >> 4) * 4 + 0x324d4)
                                    ;
                                    local_1e8 = pcVar26;
                                    local_140 = (ulong)uVar36;
                                    UVar9 = LitEnc_GetPriceMatched
                                                      ((UInt16 *)
                                                       ((ulong)(((uint)((byte)local_188[(uVar34 + 
                                                  iVar7) - 1] >>
                                                  (8 - *(byte *)((long)pp + 0x33bcc) & 0x1f)) +
                                                  ((uVar21 & *(uint *)((long)pp + 0x33bd8)) <<
                                                  (*(byte *)((long)pp + 0x33bcc) & 0x1f))) * 0x300)
                                                  * 2 + *(long *)((long)pp + 0x33be0)),
                                                  (uint)(byte)local_188[uVar33],
                                                  (uint)*(byte *)(lVar12 + (ulong)uVar33),local_208)
                                    ;
                                    auVar59 = _DAT_001ae0a0;
                                    auVar58 = _DAT_001ae090;
                                    auVar57 = _DAT_001ae080;
                                    uVar38 = (ulong)*(uint *)(kLiteralNextStates + local_d8 * 4);
                                    local_1e0 = (ulong)((int)local_1e0 + 1U & (uint)local_148);
                                    iVar44 = *(int *)((long)pp +
                                                     (ulong)(*(ushort *)
                                                              (local_1d8 + uVar38 * 0x20 +
                                                              local_1e0 * 2) >> 2 & 0xfffffffc ^
                                                            0x1fc) + 0x324d4);
                                    iVar51 = *(int *)((long)pp +
                                                     (ulong)(*(ushort *)
                                                              ((long)pp + uVar38 * 2 + 0x33d68) >> 2
                                                             & 0xfffffffc ^ 0x1fc) + 0x324d4);
                                    uVar34 = (int)local_1c8 + uVar33 + (int)local_140 + 2;
                                    if ((uint)local_238 < uVar34) {
                                      local_140 = CONCAT44(local_140._4_4_,UVar9);
                                      uVar19 = (ulong)(iVar35 + (uint)local_218);
                                      lVar27 = uVar19 - local_238;
                                      lVar12 = lVar27 + -1;
                                      auVar43._8_4_ = (int)lVar12;
                                      auVar43._0_8_ = lVar12;
                                      auVar43._12_4_ = (int)((ulong)lVar12 >> 0x20);
                                      puVar15 = (undefined4 *)(local_238 * 0x30 + local_150);
                                      uVar18 = 0;
                                      do {
                                        auVar50._8_4_ = (int)uVar18;
                                        auVar50._0_8_ = uVar18;
                                        auVar50._12_4_ = (int)(uVar18 >> 0x20);
                                        auVar55 = (auVar50 | auVar58) ^ auVar59;
                                        iVar52 = SUB164(auVar43 ^ auVar59,0);
                                        bVar39 = iVar52 < auVar55._0_4_;
                                        iVar54 = SUB164(auVar43 ^ auVar59,4);
                                        iVar56 = auVar55._4_4_;
                                        if ((bool)(~(iVar54 < iVar56 || iVar56 == iVar54 && bVar39)
                                                  & 1)) {
                                          puVar15[-0x24] = 0x40000000;
                                        }
                                        if (iVar54 >= iVar56 && (iVar56 != iVar54 || !bVar39)) {
                                          puVar15[-0x18] = 0x40000000;
                                        }
                                        auVar55 = (auVar50 | auVar57) ^ auVar59;
                                        iVar56 = auVar55._4_4_;
                                        if (iVar56 <= iVar54 &&
                                            (iVar56 != iVar54 || auVar55._0_4_ <= iVar52)) {
                                          puVar15[-0xc] = 0x40000000;
                                          *puVar15 = 0x40000000;
                                        }
                                        uVar18 = uVar18 + 4;
                                        puVar15 = puVar15 + 0x30;
                                        local_238 = uVar19;
                                      } while ((lVar27 + 3U & 0xfffffffffffffffc) != uVar18);
                                    }
                                    uVar37 = local_174 + uVar37 + UVar9 + iVar51 + iVar44 +
                                             *(int *)(local_1e0 * 0x440 + local_108 +
                                                     (ulong)(((iVar35 - (uint)local_210) - iVar7) -
                                                            3) * 4) +
                                             local_208[*(ushort *)(local_198 + uVar38 * 2) >> 4] +
                                             *(int *)((long)local_208 +
                                                     (ulong)(*(ushort *)
                                                              (uVar38 * 0x20 + local_168 +
                                                              local_1e0 * 2) >> 2 & 0xfffffffc ^
                                                            0x1fc));
                                    lVar12 = (ulong)uVar34 * 0x30;
                                    if (uVar37 < *(uint *)(local_220 + lVar12)) {
                                      puVar16 = (uint *)(lVar12 + local_220);
                                      *puVar16 = uVar37;
                                      puVar16[6] = (int)local_1c8 + uVar33 + 2;
                                      puVar16[7] = 0;
                                      puVar16[2] = 1;
                                      puVar16[3] = 1;
                                      puVar16[4] = (uint)local_218;
                                      puVar16[5] = uVar10 + 4;
                                    }
                                    pcVar26 = local_1e8;
                                    lVar27 = local_220;
                                    uVar21 = (uint)local_1a0;
                                  }
                                  uVar19 = (ulong)uVar21;
                                  iVar35 = (int)uVar29;
                                  uVar10 = iVar35 + 2;
                                  uVar29 = (ulong)uVar10;
                                  if (uVar10 == local_1cc) goto LAB_001a9820;
                                  uVar10 = *(uint *)((long)pp + (ulong)(iVar35 + 3) * 4 + 0x326d4);
                                  uVar38 = (ulong)uVar10;
                                  pcVar11 = pcVar26;
                                } while (uVar38 < 0x80);
                                iVar35 = 0x12;
                                if ((int)(uVar10 - 0x80000) < 0) {
                                  iVar35 = 6;
                                }
                                uVar10 = (uint)*(byte *)((long)pp +
                                                        (ulong)(uVar10 >> (sbyte)iVar35) + 0x304d4)
                                         + iVar35 * 2;
                                pcVar11 = (char *)(ulong)((int)local_1f0 + iVar7 + 1);
                                uVar19 = (ulong)((int)local_210 + iVar7 + 1);
                              } while( true );
                            }
                          }
LAB_001a9820:
                          local_f8 = local_f8 + 1;
                          iVar7 = (int)local_158 + -1;
                          local_f0 = (ulong)((int)local_f0 + 1);
                          UVar22 = (UInt32)local_238;
                          uVar38 = local_218;
                          uVar29 = local_228;
                          pCVar23 = local_200;
                        } while ((UInt32)local_f8 != UVar22);
                        uVar10 = Backward((CLzmaEnc *)pp,&local_22c,UVar22);
                        uVar38 = (ulong)local_22c;
                      }
                    }
                    else {
                      local_22c = *(int *)((long)pp + (ulong)(local_16c - 1) * 4 + 0x326d4) + 4;
                      uVar38 = (ulong)local_22c;
                      if (uVar34 - 1 == 0) goto LAB_001a78b6;
                      *(int *)((long)pp + 0x32f6c) = *(int *)((long)pp + 0x32f6c) + (uVar34 - 1);
                      (**(code **)((long)pp + 0x28))(*(undefined8 *)((long)pp + 0x30));
                      uVar29 = local_228;
                      uVar10 = uVar34;
                    }
                  }
                  else {
                    local_22c = (uint)uVar38;
                    if (uVar10 - 1 == 0) {
LAB_001a78b6:
                      uVar29 = local_228;
                      uVar10 = 1;
                    }
                    else {
                      *(int *)((long)pp + 0x32f6c) = *(int *)((long)pp + 0x32f6c) + (uVar10 - 1);
                      (**(code **)((long)pp + 0x28))(*(undefined8 *)((long)pp + 0x30));
                      uVar29 = local_228;
                    }
                  }
                }
              }
              else {
                iVar7 = *(int *)(local_220 + 0x18 + (ulong)uVar10 * 0x30);
                local_22c = *(uint *)(local_220 + 0x1c + (ulong)uVar10 * 0x30);
                uVar38 = (ulong)local_22c;
                *(int *)((long)pp + 0x4c4) = iVar7;
                uVar10 = iVar7 - uVar10;
              }
            }
            else {
              if (*(int *)((long)pp + 0x32f6c) == 0) {
                uVar10 = ReadMatchDistances((CLzmaEnc *)pp,local_1b8);
              }
              else {
                uVar10 = *(uint *)((long)pp + 0x4c8);
                local_1b8[0] = *(uint *)((long)pp + 0x4cc);
              }
              uVar34 = *(uint *)((long)pp + 0x4d0);
              if (uVar34 < 2) {
LAB_001a729a:
                uVar38 = 0xffffffff;
                uVar29 = local_228;
                uVar10 = 1;
              }
              else {
                uVar33 = 0x111;
                if (uVar34 < 0x111) {
                  uVar33 = uVar34;
                }
                pcVar11 = (char *)(**(code **)((long)pp + 0x18))(*(undefined8 *)((long)pp + 0x30));
                pCVar23 = local_200;
                if (uVar33 < 4) {
                  uVar33 = 3;
                }
                uVar38 = 0;
                uVar29 = 0;
                uVar37 = 0;
                do {
                  uVar19 = (ulong)(*(uint *)((long)local_130 + uVar38 * 4) + 1);
                  if ((pcVar11[-1] == pcVar11[~uVar19]) &&
                     (lVar12 = -uVar19, *pcVar11 == pcVar11[lVar12])) {
                    uVar19 = 2;
                    if (uVar34 != 2) {
                      uVar18 = 2;
                      do {
                        uVar19 = uVar18;
                        if (pcVar11[uVar18 - 1] != pcVar11[uVar18 + lVar12 + -1]) break;
                        uVar18 = uVar18 + 1;
                        uVar19 = (ulong)uVar33;
                      } while (uVar33 != uVar18);
                    }
                    uVar36 = (uint)uVar19;
                    uVar21 = (uint)uVar38;
                    if (*(uint *)((long)pp + 0x32f68) <= uVar36) goto joined_r0x001a7733;
                    if (uVar37 < uVar36) {
                      uVar29 = uVar38 & 0xffffffff;
                      uVar37 = uVar36;
                    }
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 != 4);
                uVar36 = uVar10;
                if (uVar10 < *(uint *)((long)pp + 0x32f68)) {
                  uVar33 = 0;
                  if (1 < uVar10) {
                    uVar38 = (ulong)local_1b8[0];
                    uVar33 = *(uint *)((long)pp + (ulong)(local_1b8[0] - 1) * 4 + 0x326d4);
                    if (2 < uVar38) {
                      puVar16 = (uint *)(local_98 + uVar38 * 4);
                      uVar19 = uVar38 + 0xfffffffc;
                      do {
                        uVar36 = *(uint *)((long)pp + (uVar19 & 0xffffffff) * 4 + 0x326d4);
                        if ((uVar10 != uVar36 + 1) || (uVar21 = *puVar16, uVar33 >> 7 <= uVar21))
                        break;
                        uVar8 = (int)uVar38 - 2;
                        uVar38 = (ulong)uVar8;
                        puVar16 = puVar16 + -2;
                        uVar19 = uVar19 - 2;
                        uVar10 = uVar36;
                        uVar33 = uVar21;
                      } while (2 < uVar8);
                    }
                    uVar21 = uVar10;
                    if (0x7f < uVar33) {
                      uVar21 = 1;
                    }
                    uVar36 = uVar10;
                    if (uVar10 == 2) {
                      uVar36 = uVar21;
                    }
                  }
                  if ((uVar37 < 2) ||
                     (((uVar37 + 1 < uVar36 && ((uVar37 + 2 < uVar36 || (uVar33 < 0x200)))) &&
                      ((uVar37 + 3 < uVar36 || (uVar33 < 0x8000)))))) {
                    if ((uVar34 == 2) || (uVar36 < 2)) goto LAB_001a729a;
                    UVar9 = ReadMatchDistances((CLzmaEnc *)pp,local_90);
                    *(UInt32 *)((long)pp + 0x4c8) = UVar9;
                    if (1 < UVar9) {
                      uVar10 = *(uint *)((long)pp +
                                        (ulong)(*(int *)((long)pp + 0x4cc) - 1) * 4 + 0x326d4);
                      if ((UVar9 < uVar36) || (uVar33 <= uVar10)) {
                        if ((uVar36 + 1 < UVar9) || (UVar9 == uVar36 + 1 && uVar10 >> 7 <= uVar33))
                        goto LAB_001a729a;
                        if (((uVar36 < 3) || (UVar9 + 1 < uVar36)) || (uVar33 >> 7 <= uVar10))
                        goto LAB_001a781a;
                      }
LAB_001a7714:
                      uVar38 = 0xffffffff;
                      goto LAB_001a78b6;
                    }
LAB_001a781a:
                    pcVar11 = (char *)(**(code **)((long)pp + 0x18))
                                                (*(undefined8 *)((long)pp + 0x30));
                    lVar12 = 0;
                    do {
                      uVar29 = (ulong)(*(uint *)((long)local_130 + lVar12 * 4) + 1);
                      if ((pcVar11[-1] == pcVar11[~uVar29]) &&
                         (lVar27 = -uVar29, *pcVar11 == pcVar11[lVar27])) {
                        if (uVar36 - 1 < 3) {
LAB_001a78ab:
                          uVar38 = 0xffffffff;
                          goto LAB_001a78b6;
                        }
                        lVar28 = 0;
                        while (pcVar11[lVar28 + 1] == pcVar11[lVar28 + lVar27 + 1]) {
                          lVar28 = lVar28 + 1;
                          if ((ulong)(uVar36 - 1) - 2 == lVar28) goto LAB_001a78ab;
                        }
                      }
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    local_22c = uVar33 + 4;
                    uVar38 = (ulong)local_22c;
                    iVar7 = uVar36 - 2;
                    if (iVar7 == 0) {
                      uVar10 = 2;
                      uVar29 = local_228;
                      goto LAB_001a78c1;
                    }
                  }
                  else {
                    iVar7 = uVar37 - 1;
                    uVar36 = uVar37;
                    local_22c = (uint)uVar29;
                  }
                }
                else {
                  uVar21 = *(int *)((long)pp + (ulong)(local_1b8[0] - 1) * 4 + 0x326d4) + 4;
                  uVar38 = (ulong)uVar21;
joined_r0x001a7733:
                  local_22c = uVar21;
                  iVar7 = uVar36 - 1;
                  uVar29 = local_228;
                  uVar10 = 1;
                  if (iVar7 == 0) goto LAB_001a78c1;
                }
                uVar10 = local_22c;
                *(int *)((long)pp + 0x32f6c) = *(int *)((long)pp + 0x32f6c) + iVar7;
                (**(code **)((long)pp + 0x28))(*(undefined8 *)((long)pp + 0x30));
                uVar38 = (ulong)uVar10;
                uVar29 = local_228;
                uVar10 = uVar36;
              }
            }
LAB_001a78c1:
            uVar34 = (uint)uVar29;
            uVar33 = *(uint *)((long)pp + 0x33bdc) & uVar34;
            pUVar25 = (UInt16 *)
                      ((ulong)*(uint *)((long)pp + 0x32f80) * 0x20 + local_1d8 + (ulong)uVar33 * 2);
            uVar37 = (uint)uVar38;
            if ((uVar10 == 1) && (uVar37 == 0xffffffff)) {
              RangeEnc_EncodeBit(pCVar23,pUVar25,0);
              lVar12 = (**(code **)((long)pp + 0x18))(*(undefined8 *)((long)pp + 0x30));
              pbVar20 = (byte *)(lVar12 - (ulong)*(uint *)((long)pp + 0x32f6c));
              lVar12 = (ulong)(((uint)(*(byte *)((lVar12 + -1) -
                                                (ulong)*(uint *)((long)pp + 0x32f6c)) >>
                                      (8 - *(byte *)((long)pp + 0x33bcc) & 0x1f)) +
                               ((*(uint *)((long)pp + 0x33bd8) & uVar34) <<
                               (*(byte *)((long)pp + 0x33bcc) & 0x1f))) * 0x300) * 2 +
                       *(long *)((long)pp + 0x33be0);
              uVar33 = (uint)*pbVar20;
              if (*(uint *)((long)pp + 0x32f80) < 7) {
                uVar33 = uVar33 | 0x100;
                do {
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)((ulong)(uVar33 >> 7 & 0x1fffffe) + lVar12),
                                     uVar33 >> 7 & 1);
                  bVar39 = uVar33 < 0x8000;
                  uVar33 = uVar33 * 2;
                } while (bVar39);
              }
              else {
                uVar37 = (uint)pbVar20[~(ulong)(uint)*local_130];
                uVar36 = 0x100;
                uVar33 = uVar33 | 0x100;
                do {
                  uVar37 = uVar37 * 2;
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                             (lVar12 + (ulong)((uVar33 >> 8) + uVar36 +
                                                              (uVar37 & uVar36)) * 2),
                                     uVar33 >> 7 & 1);
                  uVar36 = uVar36 & ~(uVar33 * 2 ^ uVar37);
                  bVar39 = uVar33 < 0x8000;
                  uVar33 = uVar33 * 2;
                } while (bVar39);
              }
              *(undefined4 *)((long)pp + 0x32f80) =
                   *(undefined4 *)(kLiteralNextStates + (ulong)*(uint *)((long)pp + 0x32f80) * 4);
            }
            else {
              RangeEnc_EncodeBit(pCVar23,pUVar25,1);
              pUVar25 = (UInt16 *)(local_e0 + (ulong)*(uint *)((long)pp + 0x32f80) * 2);
              if (uVar37 < 4) {
                RangeEnc_EncodeBit(pCVar23,pUVar25,1);
                if (uVar37 == 0) {
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                             (local_198 + (ulong)*(uint *)((long)pp + 0x32f80) * 2),
                                     0);
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                             ((ulong)*(uint *)((long)pp + 0x32f80) * 0x20 +
                                              local_168 + (ulong)uVar33 * 2),(uint)(uVar10 != 1));
                }
                else {
                  uVar3 = *(undefined4 *)((long)pp + (uVar38 & 0xffffffff) * 4 + 0x32f70);
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                             (local_198 + (ulong)*(uint *)((long)pp + 0x32f80) * 2),
                                     1);
                  pUVar25 = (UInt16 *)(local_58 + (ulong)*(uint *)((long)pp + 0x32f80) * 2);
                  if (uVar37 == 1) {
                    RangeEnc_EncodeBit(pCVar23,pUVar25,0);
                  }
                  else {
                    RangeEnc_EncodeBit(pCVar23,pUVar25,1);
                    RangeEnc_EncodeBit(pCVar23,(UInt16 *)
                                               (local_78 + (ulong)*(uint *)((long)pp + 0x32f80) * 2)
                                       ,uVar37 - 2);
                    if (uVar37 == 3) {
                      *(undefined4 *)((long)pp + 0x32f7c) = *(undefined4 *)((long)pp + 0x32f78);
                    }
                    *(undefined4 *)((long)pp + 0x32f78) = *(undefined4 *)((long)pp + 0x32f74);
                  }
                  uVar34 = (uint)local_228;
                  *(undefined4 *)((long)pp + 0x32f74) = *(undefined4 *)((long)pp + 0x32f70);
                  *(undefined4 *)((long)pp + 0x32f70) = uVar3;
                }
                if (uVar10 == 1) {
                  uVar33 = *(uint *)((long)pp + 0x32f80);
                  puVar14 = kShortRepNextStates;
                }
                else {
                  LenEnc_Encode2(local_68,pCVar23,uVar10 - 2,uVar33,
                                 (uint)(*(int *)((long)pp + 0x3d2e0) == 0),local_208);
                  uVar33 = *(uint *)((long)pp + 0x32f80);
                  puVar14 = kRepNextStates;
                }
                *(undefined4 *)((long)pp + 0x32f80) = *(undefined4 *)(puVar14 + (ulong)uVar33 * 4);
              }
              else {
                RangeEnc_EncodeBit(pCVar23,pUVar25,0);
                *(undefined4 *)((long)pp + 0x32f80) =
                     *(undefined4 *)(kMatchNextStates + (ulong)*(uint *)((long)pp + 0x32f80) * 4);
                LenEnc_Encode2(local_40,pCVar23,uVar10 - 2,uVar33,
                               (uint)(*(int *)((long)pp + 0x3d2e0) == 0),local_208);
                pCVar23 = local_200;
                local_22c = uVar37 - 4;
                local_210 = CONCAT44(local_210._4_4_,local_22c);
                if (local_22c < 0x80) {
                  uVar34 = (uint)*(byte *)((long)pp + (ulong)local_22c + 0x304d4);
                }
                else {
                  iVar7 = 0x12;
                  if ((int)(uVar37 - 0x80004) < 0) {
                    iVar7 = 6;
                  }
                  uVar34 = (uint)*(byte *)((long)pp + (ulong)(local_22c >> (sbyte)iVar7) + 0x304d4)
                           + iVar7 * 2;
                }
                uVar33 = uVar10 - 2;
                if (4 < uVar10) {
                  uVar33 = 3;
                }
                lVar12 = (ulong)uVar33 * 0x80 + local_48;
                uVar29 = 1;
                uVar33 = 5;
                do {
                  bVar39 = (uVar34 >> (uVar33 & 0x1f) & 1) != 0;
                  RangeEnc_EncodeBit(pCVar23,(UInt16 *)(lVar12 + uVar29 * 2),(uint)bVar39);
                  p_00 = local_200;
                  uVar29 = (ulong)((uint)bVar39 + (int)uVar29 * 2);
                  bVar39 = uVar33 != 0;
                  uVar33 = uVar33 - 1;
                } while (bVar39);
                if (3 < uVar34) {
                  iVar7 = (uVar34 >> 1) - 1;
                  uVar33 = (uVar34 & 1 | 2) << ((byte)iVar7 & 0x1f);
                  uVar37 = (uint)local_210 - uVar33;
                  uVar29 = (ulong)uVar37;
                  pCVar23 = p_00;
                  if (uVar34 < 0xe) {
                    lVar12 = local_88 + (ulong)uVar33 * 2;
                    uVar38 = 1;
                    do {
                      uVar33 = (uint)uVar29 & 1;
                      RangeEnc_EncodeBit(p_00,(UInt16 *)
                                              ((lVar12 - (ulong)(uVar34 * 2)) + -2 + uVar38 * 2),
                                         uVar33);
                      uVar38 = (ulong)(uVar33 + (int)uVar38 * 2);
                      uVar29 = uVar29 >> 1;
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                  }
                  else {
                    RangeEnc_EncodeDirectBits(local_200,uVar37 >> 4,(uVar34 >> 1) - 5);
                    lVar12 = local_80;
                    uVar29 = (ulong)(uVar37 & 0xf);
                    uVar38 = 1;
                    iVar7 = 4;
                    do {
                      uVar34 = (uint)uVar29 & 1;
                      RangeEnc_EncodeBit(p_00,(UInt16 *)(uVar38 * 2 + lVar12),uVar34);
                      uVar38 = (ulong)(uVar34 + (int)uVar38 * 2);
                      uVar29 = uVar29 >> 1;
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                    *(int *)((long)pp + 0x33bc4) = *(int *)((long)pp + 0x33bc4) + 1;
                  }
                }
                *(undefined4 *)((long)pp + 0x32f7c) = *(undefined4 *)((long)pp + 0x32f78);
                *(undefined8 *)((long)pp + 0x32f74) = *(undefined8 *)((long)pp + 0x32f70);
                *(uint *)((long)pp + 0x32f70) = (uint)local_210;
                *(int *)((long)pp + 0x3d340) = *(int *)((long)pp + 0x3d340) + 1;
                uVar34 = (uint)local_228;
              }
            }
            uVar29 = (ulong)(uVar34 + uVar10);
            piVar1 = (int *)((long)pp + 0x32f6c);
            *piVar1 = *piVar1 - uVar10;
          } while (*piVar1 != 0);
          if (*(int *)((long)pp + 0x3d2e0) == 0) {
            if (0x7f < *(uint *)((long)pp + 0x3d340)) {
              FillDistancesPrices((CLzmaEnc *)pp);
            }
            if (0xf < *(uint *)((long)pp + 0x33bc4)) {
              FillAlignPrices((CLzmaEnc *)pp);
            }
          }
          iVar7 = (**(code **)((long)pp + 0x10))(*(undefined8 *)((long)pp + 0x30));
          if (iVar7 == 0) goto LAB_001a99ba;
          uVar10 = (uVar34 + uVar10) - (int)local_e8;
        } while (uVar10 < 0x8000);
        *(long *)((long)pp + 0x3d338) = *(long *)((long)pp + 0x3d338) + (ulong)uVar10;
        iVar7 = *(int *)((long)pp + 0x3d34c);
        if (iVar7 == 0) {
          if (*(int *)((long)pp + 0x3d328) == 0) {
            if (*(int *)((long)pp + 0xb8) != 0) goto LAB_001a9a90;
            iVar7 = 0;
          }
          else {
            *(undefined4 *)((long)pp + 0x3d34c) = 9;
            if (*(int *)((long)pp + 0xb8) == 0) {
              iVar7 = 9;
            }
            else {
LAB_001a9a90:
              *(undefined4 *)((long)pp + 0x3d34c) = 8;
              iVar7 = 8;
            }
            *(undefined4 *)((long)pp + 0x3d344) = 1;
          }
        }
      }
LAB_001a99de:
      if (iVar7 != 0) {
        return iVar7;
      }
      if (*(int *)((long)pp + 0x3d344) != 0) {
        return 0;
      }
    } while ((local_b0 == (ICompressProgress *)0x0) ||
            (SVar6 = (*local_b0->Progress)
                               (local_b0,*(UInt64 *)((long)pp + 0x3d338),
                                ((*(long *)((long)pp + 0x3d320) + *(long *)((long)pp + 0x3d300)) -
                                *(long *)((long)pp + 0x3d310)) + *(long *)((long)pp + 0x3d2f8)),
            SVar6 == 0));
    SVar6 = 10;
  }
  return SVar6;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream* outStream, ISeqInStream* inStream, ICompressProgress* progress,
                    ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  SRes res = SZ_OK;

#ifdef COMPRESS_MF_MT
  Byte allocaDummy[0x300];
  (void)allocaDummy;
  int i = 0;
  for (i = 0; i < 16; i++)
    allocaDummy[i] = (Byte)i;
#endif

  RINOK(LzmaEnc_Prepare(pp, inStream, outStream, alloc, allocBig));

  for (;;) {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished != 0)
      break;
    if (progress != 0) {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK) {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  LzmaEnc_Finish(pp);
  return res;
}